

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O3

APInt * __thiscall llvm::APInt::operator*=(APInt *this,APInt *RHS)

{
  anon_union_8_2_1313ab2f_for_U local_20;
  uint local_18;
  
  if (this->BitWidth == RHS->BitWidth) {
    operator*((APInt *)&local_20,this);
    operator=(this,(APInt *)&local_20);
    if ((0x40 < local_18) && ((void *)local_20.VAL != (void *)0x0)) {
      operator_delete__(local_20.pVal);
    }
    return this;
  }
  __assert_fail("BitWidth == RHS.BitWidth && \"Bit widths must be the same\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                ,0xff,"APInt &llvm::APInt::operator*=(const APInt &)");
}

Assistant:

APInt& APInt::operator*=(const APInt& RHS) {
  assert(BitWidth == RHS.BitWidth && "Bit widths must be the same");
  *this = *this * RHS;
  return *this;
}